

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

int run_test_fs_readdir_file(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *__format;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  memset(&opendir_req,0xdb,0x1c0);
  uVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test/fixtures/empty_file",0);
  eval_a = (int64_t)iVar1;
  eval_b = -0x14;
  if (eval_a == -0x14) {
    eval_a = (int64_t)opendir_req.fs_type;
    eval_b = 0x1f;
    if (eval_a == 0x1f) {
      eval_a = opendir_req.result;
      eval_b = -0x14;
      if (opendir_req.result == -0x14) {
        if (opendir_req.ptr != (void *)0x0) {
          eval_b = 0;
          pcVar4 = "NULL";
          __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
          pcVar3 = "opendir_req.ptr";
          uVar2 = 0xf7;
          eval_a = (int64_t)opendir_req.ptr;
          goto LAB_00125f07;
        }
        uv_fs_req_cleanup(&opendir_req);
        memset(&opendir_req,0xdb,0x1c0);
        uVar2 = uv_default_loop();
        iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test/fixtures/empty_file",file_opendir_cb);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          eval_a = (int64_t)file_opendir_cb_count;
          eval_b = 0;
          if (eval_a == 0) {
            uVar2 = uv_default_loop();
            iVar1 = uv_run(uVar2,0);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              eval_a = 1;
              eval_b = (int64_t)file_opendir_cb_count;
              if (eval_b == 1) {
                loop = (uv_loop_t *)uv_default_loop();
                close_loop(loop);
                eval_a = 0;
                uVar2 = uv_default_loop();
                iVar1 = uv_loop_close(uVar2);
                eval_b = (int64_t)iVar1;
                if (eval_b == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar4 = "uv_loop_close(uv_default_loop())";
                pcVar3 = "0";
                uVar2 = 0x105;
              }
              else {
                pcVar4 = "file_opendir_cb_count";
                pcVar3 = "1";
                uVar2 = 0x104;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "r";
              uVar2 = 0x103;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "file_opendir_cb_count";
            uVar2 = 0x101;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar2 = 0x100;
        }
      }
      else {
        pcVar4 = "UV_ENOTDIR";
        pcVar3 = "opendir_req.result";
        uVar2 = 0xf6;
      }
    }
    else {
      pcVar4 = "UV_FS_OPENDIR";
      pcVar3 = "opendir_req.fs_type";
      uVar2 = 0xf5;
    }
  }
  else {
    pcVar4 = "UV_ENOTDIR";
    pcVar3 = "r";
    uVar2 = 0xf4;
  }
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
LAB_00125f07:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(fs_readdir_file) {
  const char* path;
  int r;

  path = "test/fixtures/empty_file";

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, path, NULL);

  ASSERT_EQ(r, UV_ENOTDIR);
  ASSERT_EQ(opendir_req.fs_type, UV_FS_OPENDIR);
  ASSERT_EQ(opendir_req.result, UV_ENOTDIR);
  ASSERT_NULL(opendir_req.ptr);

  uv_fs_req_cleanup(&opendir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the async flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, path, file_opendir_cb);
  ASSERT_OK(r);
  ASSERT_OK(file_opendir_cb_count);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);
  ASSERT_EQ(1, file_opendir_cb_count);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}